

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

find_result __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::find_child(basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
             *this,byte key_byte)

{
  undefined1 auVar1 [16];
  byte bVar2;
  pair<unsigned_char,_unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  pVar3;
  find_result fVar4;
  reference local_c0;
  byte local_b1;
  uint local_b0;
  uint uStack_ac;
  uint8_t i;
  uint bit_field;
  uint mask;
  __m128i matching_key_positions;
  __m128i replicated_search_key;
  byte key_byte_local;
  basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *local_68;
  longlong local_28;
  
  auVar1 = vpinsrb_avx(ZEXT116(key_byte),(uint)key_byte,1);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,2);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,3);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,4);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,5);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,6);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,7);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,8);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,9);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,10);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xe);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xf);
  local_28 = auVar1._0_8_;
  matching_key_positions[1] = local_28;
  _bit_field = vpcmpeqb_avx(auVar1,(undefined1  [16])this->keys);
  bVar2 = in_critical_section::operator_cast_to_unsigned_char
                    ((in_critical_section *)
                     &(this->
                      super_basic_inode_16_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      ).
                      super_basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      .children_count);
  uStack_ac = (1 << (bVar2 & 0x1f)) - 1;
  local_b0 = (ushort)((ushort)(SUB161(_bit_field >> 7,0) & 1) |
                      (ushort)(SUB161(_bit_field >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(_bit_field >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(_bit_field >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(_bit_field >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(_bit_field >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(_bit_field >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(_bit_field >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(_bit_field >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(_bit_field >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(_bit_field >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(_bit_field >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(_bit_field >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(_bit_field >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(_bit_field >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(bit_field._15_1_ >> 7) << 0xf) & uStack_ac;
  if (local_b0 == 0) {
    this_local._0_1_ = 0xff;
    local_68 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                *)0x0;
  }
  else {
    local_b1 = ctz<unsigned_int>(local_b0);
    local_c0 = std::
               array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_16UL>
               ::operator[](&this->children,(ulong)local_b1);
    pVar3 = std::
            make_pair<unsigned_char_const&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>
                      (&local_b1,&local_c0);
    local_68 = pVar3.second;
    this_local._0_1_ = pVar3.first;
  }
  fVar4._1_7_ = (undefined7)((ulong)local_68 >> 8);
  fVar4.first = (uchar)this_local;
  fVar4.second = local_68;
  return fVar4;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr find_result find_child(
      std::byte key_byte) noexcept {
#ifdef UNODB_DETAIL_X86_64
    const auto replicated_search_key =
        _mm_set1_epi8(static_cast<char>(key_byte));
    const auto matching_key_positions =
        _mm_cmpeq_epi8(replicated_search_key, keys.byte_vector);
    const auto mask = (1U << this->children_count) - 1;
    const auto bit_field =
        static_cast<unsigned>(_mm_movemask_epi8(matching_key_positions)) & mask;
    if (bit_field != 0) {
      const auto i = detail::ctz(bit_field);
      return std::make_pair(
          i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
    }
    return parent_class::child_not_found;
#elif defined(__aarch64__)
    const auto replicated_search_key =
        vdupq_n_u8(static_cast<std::uint8_t>(key_byte));
    const auto matching_key_positions =
        vceqq_u8(replicated_search_key, keys.byte_vector);
    const auto narrowed_positions =
        vshrn_n_u16(vreinterpretq_u16_u8(matching_key_positions), 4);
    const auto scalar_pos =
        // NOLINTNEXTLINE(misc-const-correctness)
        vget_lane_u64(vreinterpret_u64_u8(narrowed_positions), 0);
    const auto child_count = this->children_count.load();
    const auto mask = (child_count == 16) ? 0xFFFFFFFF'FFFFFFFFULL
                                          : (1ULL << (child_count << 2U)) - 1;
    const auto masked_pos = scalar_pos & mask;

    if (masked_pos == 0) return parent_class::child_not_found;

    const auto i = static_cast<unsigned>(detail::ctz(masked_pos) >> 2U);
    return std::make_pair(
        i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
#else
    for (size_t i = 0; i < this->children_count.load(); ++i)
      if (key_byte == keys.byte_array[i])
        return std::make_pair(
            i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
    return parent_class::child_not_found;
#endif
  }